

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix<Finite> __thiscall
Matrix<Finite>::submatrix(Matrix<Finite> *this,uint x1,uint y1,uint x2,uint y2)

{
  uint uVar1;
  Finite *pFVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  Finite *extraout_RDX;
  uint uVar9;
  undefined4 in_register_00000034;
  long lVar10;
  uint in_R9D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint uVar11;
  Matrix<Finite> MVar12;
  
  uVar4 = y2;
  if (y1 >= y2 && y1 != y2) {
    uVar4 = y1;
  }
  uVar5 = (ulong)y2;
  if (y1 < y2) {
    y2 = y1;
  }
  uVar9 = in_R9D;
  if (in_R9D < x2) {
    uVar9 = x2;
  }
  uVar11 = in_R9D;
  if (x2 < in_R9D) {
    uVar11 = x2;
  }
  lVar8 = y1 - uVar5;
  lVar10 = -lVar8;
  if (0 < lVar8) {
    lVar10 = lVar8;
  }
  lVar6 = (ulong)x2 - (ulong)in_R9D;
  lVar8 = -lVar6;
  if (0 < lVar6) {
    lVar8 = lVar6;
  }
  Matrix(this,(int)lVar10 + 1,(int)lVar8 + 1);
  uVar7 = y2;
  do {
    uVar5 = 0;
    do {
      iVar3 = (int)uVar5;
      uVar1 = this->N;
      pFVar2 = this->arr;
      __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            ((ulong)(uVar11 + iVar3) * 0x20 +
            (ulong)(*(int *)(CONCAT44(in_register_00000034,x1) + 4) * uVar7) * 0x20 +
            *(long *)(CONCAT44(in_register_00000034,x1) + 8));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (pFVar2 + uVar1 * (uVar7 - y2) + uVar5),__x);
      pFVar2[uVar1 * (uVar7 - y2) + uVar5].val.negative =
           *(bool *)&__x[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar5 = (ulong)(iVar3 + 1);
    } while (uVar11 + iVar3 + 1 <= uVar9);
    uVar7 = uVar7 + 1;
  } while (uVar7 <= uVar4);
  MVar12.arr = extraout_RDX;
  MVar12._0_8_ = this;
  return MVar12;
}

Assistant:

const Matrix<Field> Matrix<Field>::submatrix(unsigned x1, unsigned y1, unsigned x2, unsigned y2) const
{
    if(x1 > x2)
        std::swap(x1, x2);
    if(y1 > y2)
        std::swap(y1, y2);
    Matrix res(x2 - x1 + 1, y2 - y1 + 1);
    for(unsigned i = x1; i <= x2; ++i)
    {
        for(unsigned j = y1; j <= y2; ++j)
        {
            res[i - x1][j - y1] = (*this)[i][j];
        }
    }
    return res;
}